

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::filterTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   *__return_storage_ptr__,
                  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  pointer pTVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t in_R8;
  TestCaseHandle *testCase;
  pointer testCase_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> filtered;
  _Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
            ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)&local_48,
             (long)(testCases->
                   super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(testCases->
                   super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  testCase_00 = (testCases->
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
                _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (testCases->
           super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (testCase_00 == pTVar1) {
      uVar3 = (*config->_vptr_IConfig[0x12])(config);
      uVar4 = (*config->_vptr_IConfig[0x13])(config);
      createShard<std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>
                (__return_storage_ptr__,(Catch *)&local_48,
                 (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                 (ulong)uVar3,(ulong)uVar4,in_R8);
      std::_Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::
      ~_Vector_base(&local_48);
      return __return_storage_ptr__;
    }
    if ((testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (testSpec->m_filters).
        super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if ((testCase_00->m_info->properties & IsHidden) == None) goto LAB_0013f432;
    }
    else {
      bVar2 = TestSpec::matches(testSpec,testCase_00->m_info);
      if ((bVar2) && (bVar2 = isThrowSafe(testCase_00,config), bVar2)) {
LAB_0013f432:
        std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::push_back
                  ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                   &local_48,testCase_00);
      }
    }
    testCase_00 = testCase_00 + 1;
  } while( true );
}

Assistant:

std::vector<TestCaseHandle> filterTests( std::vector<TestCaseHandle> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCaseHandle> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.getTestCaseInfo().isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return createShard(filtered, config.shardCount(), config.shardIndex());
    }